

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

object_ptr __thiscall mjs::object::get_accessor_property_object(object *this,wstring_view name)

{
  bool bVar1;
  gc_heap_ptr_untyped *p;
  logic_error *this_00;
  wchar_t *in_RCX;
  undefined8 extraout_RDX;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar2;
  object_ptr oVar3;
  wstring_view key;
  value local_40;
  
  key._M_str = in_RCX;
  key._M_len = (size_t)name._M_str;
  pVar2 = find((object *)name._M_len,key);
  bVar1 = has_attributes((pVar2.first)->attributes_,accessor);
  if (bVar1) {
    value_representation::get_value(&local_40,&(pVar2.first)->value_,((object *)name._M_len)->heap_)
    ;
    p = &value::object_value(&local_40)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,p);
    value::~value(&local_40);
    oVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    oVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (object_ptr)oVar3.super_gc_heap_ptr_untyped;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"get_accessor_property_fields called on non-accessor property");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

object_ptr object::get_accessor_property_object(const std::wstring_view name) {
    auto it = find(name).first;
    if (!has_attributes(it->attributes(), property_attribute::accessor)) {
        throw std::logic_error{"get_accessor_property_fields called on non-accessor property"};
    }
    return it->raw_get(heap_).object_value();
}